

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

SQInteger __thiscall SQLexer::ReadString(SQLexer *this,SQInteger ndelim,bool verbatim,bool advance)

{
  int iVar1;
  size_type sVar2;
  ulong uVar3;
  char *pcVar4;
  byte in_CL;
  byte in_DL;
  ulong in_RSI;
  SQLexer *in_RDI;
  SQInteger len;
  SQChar *stemp_1;
  SQChar temp_1 [9];
  SQInteger maxdigits_1;
  SQChar *stemp;
  SQChar temp [3];
  SQInteger maxdigits;
  SQInteger x;
  SQInteger t;
  sqvector<char,_unsigned_int> *in_stack_ffffffffffffff48;
  SQLexer *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  SQLexer *in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff70;
  LexChar in_stack_ffffffffffffff71;
  LexChar in_stack_ffffffffffffff72;
  undefined1 in_stack_ffffffffffffff73;
  LexChar in_stack_ffffffffffffff74;
  undefined1 in_stack_ffffffffffffff75;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  char *local_80;
  char local_71 [9];
  long local_68;
  undefined1 local_59;
  char *local_58;
  char local_4b [3];
  undefined8 local_48;
  undefined1 local_3a;
  LexChar local_39;
  ulong local_38;
  undefined1 local_29;
  SQInteger local_28;
  byte local_1a;
  byte local_19;
  ulong local_18;
  SQInteger local_8;
  
  local_19 = in_DL & 1;
  local_1a = in_CL & 1;
  local_28 = 0x103;
  if ((in_RDI->_state == LS_TEMPALTE) && (in_RSI != 0x22)) {
    SQCompilation::SQCompilationContext::reportDiagnostic
              (in_RDI->_ctx,DI_EXPECTED_LEX,(int32_t)(in_RDI->_tokenline & 0xffffffff),
               (int32_t)(in_RDI->_tokencolumn & 0xffffffff),
               (int32_t)(ulong)(uint)((int)in_RDI->_currentcolumn - (int)in_RDI->_tokencolumn),
               "string");
    local_8 = -1;
  }
  else {
    local_29 = 0;
    local_18 = in_RSI;
    sqvector<char,_unsigned_int>::resize
              ((sqvector<char,_unsigned_int> *)in_RDI,
               (size_type)((ulong)in_stack_ffffffffffffff58 >> 0x20),
               (char *)in_stack_ffffffffffffff50);
    if ((local_1a & 1) != 0) {
      Next(in_RDI);
      in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
    }
    if (in_RDI->_currdata == '\0') {
      local_8 = -1;
    }
    else {
LAB_00159266:
      while( true ) {
        while (in_RDI->_currdata == local_18) {
          Next(in_RDI);
          in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
          if (in_RDI->_state == LS_TEMPALTE) {
            local_28 = 0x153;
          }
          if (((local_19 & 1) == 0) || (in_RDI->_currdata != '\"')) goto LAB_00159932;
          in_stack_ffffffffffffff71 = in_RDI->_currdata;
          sqvector<char,_unsigned_int>::push_back
                    ((sqvector<char,_unsigned_int> *)in_stack_ffffffffffffff50,
                     (char *)in_stack_ffffffffffffff48);
          Next(in_RDI);
          in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
        }
        local_38 = (ulong)in_RDI->_currdata;
        if (local_38 == 0) {
          SQCompilation::SQCompilationContext::reportDiagnostic
                    (in_RDI->_ctx,DI_UNFINISHED_STRING,(int32_t)(in_RDI->_tokenline & 0xffffffff),
                     (int32_t)(in_RDI->_tokencolumn & 0xffffffff),
                     (int32_t)(ulong)(uint)((int)in_RDI->_currentcolumn - (int)in_RDI->_tokencolumn)
                    );
          return -1;
        }
        if (local_38 != 10) break;
        if ((local_19 & 1) == 0) {
          SQCompilation::SQCompilationContext::reportDiagnostic
                    (in_RDI->_ctx,DI_NEWLINE_IN_CONST,(int32_t)(in_RDI->_tokenline & 0xffffffff),
                     (int32_t)(in_RDI->_tokencolumn & 0xffffffff),
                     (int32_t)(ulong)(uint)((int)in_RDI->_currentcolumn - (int)in_RDI->_tokencolumn)
                    );
        }
        local_39 = in_RDI->_currdata;
        sqvector<char,_unsigned_int>::push_back
                  ((sqvector<char,_unsigned_int> *)in_stack_ffffffffffffff50,
                   (char *)in_stack_ffffffffffffff48);
        Next(in_RDI);
        in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
        nextLine(in_stack_ffffffffffffff50);
      }
      if (local_38 == 0x5c) {
        if ((local_19 & 1) != 0) {
          local_3a = 0x5c;
          sqvector<char,_unsigned_int>::push_back
                    ((sqvector<char,_unsigned_int> *)in_stack_ffffffffffffff50,
                     (char *)in_stack_ffffffffffffff48);
          Next(in_RDI);
          in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
          goto LAB_00159266;
        }
        Next(in_RDI);
        in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
        in_stack_ffffffffffffff50 = (SQLexer *)(ulong)(in_RDI->_currdata - 0x22);
        switch(in_stack_ffffffffffffff50) {
        case (SQLexer *)0x0:
          in_stack_ffffffffffffff76 = 0x22;
          sqvector<char,_unsigned_int>::push_back
                    ((sqvector<char,_unsigned_int> *)in_stack_ffffffffffffff50,
                     (char *)in_stack_ffffffffffffff48);
          Next(in_RDI);
          in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
          goto LAB_00159266;
        case (SQLexer *)0x5:
          in_stack_ffffffffffffff75 = 0x27;
          sqvector<char,_unsigned_int>::push_back
                    ((sqvector<char,_unsigned_int> *)in_stack_ffffffffffffff50,
                     (char *)in_stack_ffffffffffffff48);
          Next(in_RDI);
          in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
          goto LAB_00159266;
        case (SQLexer *)0xe:
          sqvector<char,_unsigned_int>::push_back
                    ((sqvector<char,_unsigned_int> *)in_stack_ffffffffffffff50,
                     (char *)in_stack_ffffffffffffff48);
          Next(in_RDI);
          in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
          goto LAB_00159266;
        case (SQLexer *)0x33:
        case (SQLexer *)0x53:
          iVar1 = 8;
          if (in_RDI->_currdata == 'u') {
            iVar1 = 4;
          }
          local_68 = (long)iVar1;
          ProcessStringHexEscape
                    ((SQLexer *)
                     CONCAT17(in_stack_ffffffffffffff77,
                              CONCAT16(in_stack_ffffffffffffff76,
                                       CONCAT15(in_stack_ffffffffffffff75,
                                                CONCAT14(in_stack_ffffffffffffff74,
                                                         CONCAT13(in_stack_ffffffffffffff73,
                                                                  CONCAT12(in_stack_ffffffffffffff72
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff71,
                                                  in_stack_ffffffffffffff70))))))),
                     (SQChar *)in_stack_ffffffffffffff68,(SQInteger)in_RDI);
          strtoul(local_71,&local_80,0x10);
          AddUTF8(in_stack_ffffffffffffff68,(SQUnsignedInteger)in_RDI);
          goto LAB_00159266;
        case (SQLexer *)0x3a:
          in_stack_ffffffffffffff77 = 0x5c;
          sqvector<char,_unsigned_int>::push_back
                    ((sqvector<char,_unsigned_int> *)in_stack_ffffffffffffff50,
                     (char *)in_stack_ffffffffffffff48);
          Next(in_RDI);
          in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
          goto LAB_00159266;
        case (SQLexer *)0x3f:
          sqvector<char,_unsigned_int>::push_back
                    ((sqvector<char,_unsigned_int> *)in_stack_ffffffffffffff50,
                     (char *)in_stack_ffffffffffffff48);
          Next(in_RDI);
          in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
          goto LAB_00159266;
        case (SQLexer *)0x40:
          sqvector<char,_unsigned_int>::push_back
                    ((sqvector<char,_unsigned_int> *)in_stack_ffffffffffffff50,
                     (char *)in_stack_ffffffffffffff48);
          Next(in_RDI);
          in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
          goto LAB_00159266;
        case (SQLexer *)0x44:
          sqvector<char,_unsigned_int>::push_back
                    ((sqvector<char,_unsigned_int> *)in_stack_ffffffffffffff50,
                     (char *)in_stack_ffffffffffffff48);
          Next(in_RDI);
          in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
          goto LAB_00159266;
        case (SQLexer *)0x4c:
          sqvector<char,_unsigned_int>::push_back
                    ((sqvector<char,_unsigned_int> *)in_stack_ffffffffffffff50,
                     (char *)in_stack_ffffffffffffff48);
          Next(in_RDI);
          in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
          goto LAB_00159266;
        case (SQLexer *)0x50:
          sqvector<char,_unsigned_int>::push_back
                    ((sqvector<char,_unsigned_int> *)in_stack_ffffffffffffff50,
                     (char *)in_stack_ffffffffffffff48);
          Next(in_RDI);
          in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
          goto LAB_00159266;
        case (SQLexer *)0x52:
          sqvector<char,_unsigned_int>::push_back
                    ((sqvector<char,_unsigned_int> *)in_stack_ffffffffffffff50,
                     (char *)in_stack_ffffffffffffff48);
          Next(in_RDI);
          in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
          goto LAB_00159266;
        case (SQLexer *)0x54:
          sqvector<char,_unsigned_int>::push_back
                    ((sqvector<char,_unsigned_int> *)in_stack_ffffffffffffff50,
                     (char *)in_stack_ffffffffffffff48);
          Next(in_RDI);
          in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
          goto LAB_00159266;
        case (SQLexer *)0x56:
          local_48 = 2;
          ProcessStringHexEscape
                    ((SQLexer *)
                     CONCAT17(in_stack_ffffffffffffff77,
                              CONCAT16(in_stack_ffffffffffffff76,
                                       CONCAT15(in_stack_ffffffffffffff75,
                                                CONCAT14(in_stack_ffffffffffffff74,
                                                         CONCAT13(in_stack_ffffffffffffff73,
                                                                  CONCAT12(in_stack_ffffffffffffff72
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff71,
                                                  in_stack_ffffffffffffff70))))))),
                     (SQChar *)in_stack_ffffffffffffff68,(SQInteger)in_RDI);
          in_stack_ffffffffffffff48 = &in_RDI->_longstr;
          uVar3 = strtoul(local_4b,&local_58,0x10);
          local_59 = (undefined1)uVar3;
          sqvector<char,_unsigned_int>::push_back
                    ((sqvector<char,_unsigned_int> *)in_stack_ffffffffffffff50,
                     (char *)in_stack_ffffffffffffff48);
          goto LAB_00159266;
        case (SQLexer *)0x59:
        case (SQLexer *)0x5b:
          if (in_RDI->_state == LS_TEMPALTE) {
            in_stack_ffffffffffffff74 = in_RDI->_currdata;
            sqvector<char,_unsigned_int>::push_back
                      ((sqvector<char,_unsigned_int> *)in_stack_ffffffffffffff50,
                       (char *)in_stack_ffffffffffffff48);
            Next(in_RDI);
            in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
            goto LAB_00159266;
          }
        }
        SQCompilation::SQCompilationContext::reportDiagnostic
                  (in_RDI->_ctx,DI_UNRECOGNISED_ESCAPER,(int32_t)(in_RDI->_tokenline & 0xffffffff),
                   (int32_t)(in_RDI->_tokencolumn & 0xffffffff),
                   (int32_t)(ulong)(uint)((int)in_RDI->_currentcolumn - (int)in_RDI->_tokencolumn));
        goto LAB_00159266;
      }
      if ((local_38 != 0x7b) || (in_RDI->_state != LS_TEMPALTE)) {
        in_stack_ffffffffffffff72 = in_RDI->_currdata;
        sqvector<char,_unsigned_int>::push_back
                  ((sqvector<char,_unsigned_int> *)in_stack_ffffffffffffff50,
                   (char *)in_stack_ffffffffffffff48);
        Next(in_RDI);
        in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
        goto LAB_00159266;
      }
      sqvector<char,_unsigned_int>::push_back
                ((sqvector<char,_unsigned_int> *)in_stack_ffffffffffffff50,
                 (char *)in_stack_ffffffffffffff48);
      Next(in_RDI);
      in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
      local_28 = in_RDI->_expectedToken;
LAB_00159932:
      sqvector<char,_unsigned_int>::push_back
                ((sqvector<char,_unsigned_int> *)in_stack_ffffffffffffff50,
                 (char *)in_stack_ffffffffffffff48);
      sVar2 = sqvector<char,_unsigned_int>::size(&in_RDI->_longstr);
      uVar3 = (ulong)(sVar2 - 1);
      if (local_18 == 0x27) {
        if (uVar3 == 0) {
          SQCompilation::SQCompilationContext::reportDiagnostic
                    (in_RDI->_ctx,DI_EMPTY_LITERAL,(int32_t)(in_RDI->_tokenline & 0xffffffff),
                     (int32_t)(in_RDI->_tokencolumn & 0xffffffff),
                     (int32_t)(ulong)(uint)((int)in_RDI->_currentcolumn - (int)in_RDI->_tokencolumn)
                    );
        }
        if (1 < (long)uVar3) {
          SQCompilation::SQCompilationContext::reportDiagnostic
                    (in_RDI->_ctx,DI_TOO_LONG_LITERAL,(int32_t)(in_RDI->_tokenline & 0xffffffff),
                     (int32_t)(in_RDI->_tokencolumn & 0xffffffff),
                     (int32_t)(ulong)(uint)((int)in_RDI->_currentcolumn - (int)in_RDI->_tokencolumn)
                    );
        }
        pcVar4 = sqvector<char,_unsigned_int>::operator[](&in_RDI->_longstr,0);
        in_RDI->_nvalue = (long)*pcVar4;
        local_8 = 0x104;
      }
      else {
        SetStringValue(in_stack_ffffffffffffff50);
        local_8 = local_28;
      }
    }
  }
  return local_8;
}

Assistant:

SQInteger SQLexer::ReadString(SQInteger ndelim,bool verbatim, bool advance)
{
    SQInteger t = TK_STRING_LITERAL;
    if (_state == LS_TEMPALTE && ndelim != _SC('\"')) {
        _ctx.reportDiagnostic(DiagnosticsId::DI_EXPECTED_LEX, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "string");
        return -1;
    }
    INIT_TEMP_STRING();
    if (advance)
      NEXT();
    if(IS_EOB()) return -1;
    for(;;) {
        while(CUR_CHAR != ndelim) {
            SQInteger x = CUR_CHAR;
            switch (x) {
            case SQUIRREL_EOB:
                _ctx.reportDiagnostic(DiagnosticsId::DI_UNFINISHED_STRING, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                return -1;
            case _SC('\n'):
                if(!verbatim)
                    _ctx.reportDiagnostic(DiagnosticsId::DI_NEWLINE_IN_CONST, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                APPEND_CHAR(CUR_CHAR); NEXT();
                nextLine();
                break;
            case _SC('\\'):
                if(verbatim) {
                    APPEND_CHAR('\\'); NEXT();
                }
                else {
                    NEXT();
                    switch(CUR_CHAR) {
                    case _SC('x'):  {
                        const SQInteger maxdigits = sizeof(SQChar) * 2;
                        SQChar temp[maxdigits + 1];
                        ProcessStringHexEscape(temp, maxdigits);
                        SQChar *stemp;
                        APPEND_CHAR((SQChar)strtoul(temp, &stemp, 16));
                    }
                    break;
                    case _SC('U'):
                    case _SC('u'):  {
                        const SQInteger maxdigits = CUR_CHAR == 'u' ? 4 : 8;
                        SQChar temp[8 + 1];
                        ProcessStringHexEscape(temp, maxdigits);
                        SQChar *stemp;
                        AddUTF8(strtoul(temp, &stemp, 16));
                    }
                    break;
                    case _SC('t'): APPEND_CHAR(_SC('\t')); NEXT(); break;
                    case _SC('a'): APPEND_CHAR(_SC('\a')); NEXT(); break;
                    case _SC('b'): APPEND_CHAR(_SC('\b')); NEXT(); break;
                    case _SC('n'): APPEND_CHAR(_SC('\n')); NEXT(); break;
                    case _SC('r'): APPEND_CHAR(_SC('\r')); NEXT(); break;
                    case _SC('v'): APPEND_CHAR(_SC('\v')); NEXT(); break;
                    case _SC('f'): APPEND_CHAR(_SC('\f')); NEXT(); break;
                    case _SC('0'): APPEND_CHAR(_SC('\0')); NEXT(); break;
                    case _SC('\\'): APPEND_CHAR(_SC('\\')); NEXT(); break;
                    case _SC('"'): APPEND_CHAR(_SC('"')); NEXT(); break;
                    case _SC('\''): APPEND_CHAR(_SC('\'')); NEXT(); break;
                    case _SC('{'): case _SC('}'):
                        if (_state == LS_TEMPALTE) {
                          APPEND_CHAR(CUR_CHAR);
                          NEXT();
                          break;
                        }
                    // fall through -V796
                    default:
                        _ctx.reportDiagnostic(DiagnosticsId::DI_UNRECOGNISED_ESCAPER, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                    break;
                    }
                }
                break;
            case _SC('{'):
                if (_state == LS_TEMPALTE) {
                    APPEND_CHAR(CUR_CHAR);
                    NEXT();
                    assert(_expectedToken > 0);
                    t = _expectedToken;
                    goto loop_exit;
                }
            default:
                APPEND_CHAR(CUR_CHAR);
                NEXT();
            }
        }
        NEXT();

        if (_state == LS_TEMPALTE)
          t = TK_TEMPLATE_SUFFIX;

        if(verbatim && CUR_CHAR == '"') { //double quotation
            APPEND_CHAR(CUR_CHAR);
            NEXT();
        }
        else {
            break;
        }
    }

loop_exit:
    TERMINATE_BUFFER();
    SQInteger len = _longstr.size()-1;
    if(ndelim == _SC('\'')) {
        assert(_state != LS_TEMPALTE);
        if(len == 0)
            _ctx.reportDiagnostic(DiagnosticsId::DI_EMPTY_LITERAL, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
        if(len > 1)
            _ctx.reportDiagnostic(DiagnosticsId::DI_TOO_LONG_LITERAL, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
        _nvalue = _longstr[0];
        return TK_INTEGER;
    }
    SetStringValue();
    return t;
}